

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O0

void __thiscall
license::EventRegistry::addEvent
          (EventRegistry *this,EVENT_TYPE event,SEVERITY severity,string *eventParameter)

{
  char *__src;
  undefined1 local_228 [8];
  AuditEvent audit;
  string *eventParameter_local;
  SEVERITY severity_local;
  EVENT_TYPE event_local;
  EventRegistry *this_local;
  
  local_228._0_4_ = severity;
  local_228._4_4_ = event;
  audit.param2._248_8_ = eventParameter;
  __src = (char *)std::__cxx11::string::c_str();
  strncpy((char *)&audit,__src,0xff);
  audit.param1[0xf8] = '\0';
  std::vector<AuditEvent,_std::allocator<AuditEvent>_>::push_back
            (&this->logs,(value_type *)local_228);
  return;
}

Assistant:

void EventRegistry::addEvent(EVENT_TYPE event, SEVERITY severity,
		const string& eventParameter) {
	AuditEvent audit;
	audit.severity = severity;
	audit.event_type = event;
	strncpy(audit.param1, eventParameter.c_str(), 255);
	audit.param2[0] = '\0';
	logs.push_back(audit);
}